

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O2

void __thiscall
duckdb::roaring::ContainerMetadataCollection::Deserialize
          (ContainerMetadataCollection *this,data_ptr_t src,idx_t container_count)

{
  pointer __dest;
  pointer puVar1;
  idx_t iVar2;
  byte *pbVar3;
  size_t __n;
  data_ptr_t src_00;
  idx_t i;
  size_type __n_00;
  idx_t count;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
             container_count + 0x1f & 0xffffffffffffffe0);
  this->count_in_segment = container_count;
  iVar2 = BitpackingPrimitives::GetRequiredSize
                    ((long)(this->container_type).
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(this->container_type).
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,'\x02');
  BitpackingPrimitives::UnPackBuffer<unsigned_char>
            ((this->container_type).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,src,container_count,'\x02',true);
  count = 0;
  for (__n_00 = 0; container_count != __n_00; __n_00 = __n_00 + 1) {
    pbVar3 = vector<unsigned_char,_true>::get<true>(&this->container_type,__n_00);
    count = count + ((*pbVar3 >> 1 & 1) != 0);
  }
  src_00 = src + iVar2;
  this->runs_in_segment = count;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&(this->number_of_runs).super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             count + 0x1f & 0xffffffffffffffe0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&(this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             container_count - count);
  if (count != 0) {
    iVar2 = BitpackingPrimitives::GetRequiredSize(count,'\a');
    BitpackingPrimitives::UnPackBuffer<unsigned_char>
              ((this->number_of_runs).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,src_00,count,'\a',true);
    src_00 = src_00 + iVar2;
  }
  __dest = (this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__dest != puVar1) {
    __n = (long)puVar1 - (long)__dest;
    this->arrays_in_segment = __n;
    switchD_0193dc74::default(__dest,src_00,__n);
    return;
  }
  return;
}

Assistant:

void ContainerMetadataCollection::Deserialize(data_ptr_t src, idx_t container_count) {
	container_type.resize(AlignValue<idx_t, BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE>(container_count));
	count_in_segment = container_count;

	// Load the types of the containers
	idx_t types_size = BitpackingPrimitives::GetRequiredSize(container_type.size(), 2);
	BitpackingPrimitives::UnPackBuffer<uint8_t>(container_type.data(), src, container_count, 2, true);
	src += types_size;

	// Figure out how many are run containers
	idx_t runs_count = 0;
	for (idx_t i = 0; i < container_count; i++) {
		auto type = container_type[i];
		runs_count += ((type >> 1) & 1) == 1;
	}
	runs_in_segment = runs_count;
	number_of_runs.resize(AlignValue<idx_t, BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE>(runs_count));
	cardinality.resize(container_count - runs_count);

	// Load the run containers
	if (runs_count) {
		idx_t runs_size = BitpackingPrimitives::GetRequiredSize(runs_count, RUN_CONTAINER_SIZE_BITWIDTH);
		BitpackingPrimitives::UnPackBuffer<uint8_t>(number_of_runs.data(), src, runs_count, RUN_CONTAINER_SIZE_BITWIDTH,
		                                            true);
		src += runs_size;
	}

	// Load the array/bitset containers
	if (!cardinality.empty()) {
		idx_t arrays_size = sizeof(uint8_t) * cardinality.size();
		arrays_in_segment = arrays_size;
		memcpy(cardinality.data(), src, arrays_size);
	}
}